

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

char * fmt::v11::detail::parse_format_specs<char>
                 (char *begin,char *end,dynamic_format_specs<char> *specs,parse_context<char> *ctx,
                 type arg_type)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  parse_dynamic_spec_result<char> pVar8;
  basic_string_view<char> s;
  
  if ((long)end - (long)begin < 2) {
    if (begin == end) {
      return begin;
    }
  }
  else if (((byte)begin[1] - 0x3c < 0x23) &&
          ((0x400000005U >> ((ulong)((byte)begin[1] - 0x3c) & 0x3f) & 1) != 0)) {
    bVar2 = 0;
    goto LAB_00295020;
  }
  bVar2 = *begin;
LAB_00295020:
  uVar6 = 1 << ((byte)arg_type & 0x1f);
  uVar5 = arg_type - int_type;
  uVar1 = 0;
  do {
    switch(bVar2) {
    case 0x20:
    case 0x2b:
      (specs->super_format_specs).super_basic_specs.data_ =
           (uint)(bVar2 == 0x20) * 0x400 +
           ((specs->super_format_specs).super_basic_specs.data_ & 0xfffff3ff) + 0x800;
    case 0x2d:
      if (((uVar6 & 0xe2a) == 0) || (1 < uVar1)) goto LAB_002953b0;
      begin = (char *)((byte *)begin + 1);
      uVar1 = 2;
      break;
    default:
      bVar2 = *begin;
      if (bVar2 == 0x7d) {
        return (char *)(byte *)begin;
      }
      uVar3 = (ulong)((uint)(0x3a55000000000000 >> (bVar2 >> 2 & 0x3e)) & 3);
      pbVar7 = (byte *)begin + uVar3 + 1;
      if ((byte *)end == pbVar7 || (long)end - (long)pbVar7 < 0) goto LAB_002953b0;
      if (bVar2 == 0x7b) {
        report_error("invalid fill character \'{\'");
      }
      bVar2 = *pbVar7;
      if (bVar2 == 0x3c) {
        uVar4 = 8;
      }
      else if (bVar2 == 0x5e) {
        uVar4 = 0x18;
      }
      else {
        if (bVar2 != 0x3e) goto LAB_002953b0;
        uVar4 = 0x10;
      }
      if (uVar1 != 0) goto LAB_002953b0;
      s.size_ = uVar3 + 1;
      s.data_ = begin;
      basic_specs::set_fill<char>((basic_specs *)specs,s);
      (specs->super_format_specs).super_basic_specs.data_ =
           (specs->super_format_specs).super_basic_specs.data_ & 0xffffffc7 | uVar4;
      begin = (char *)((byte *)begin + uVar3 + 2);
      uVar1 = 1;
      break;
    case 0x23:
      if ((10 < uVar5) || (2 < uVar1)) goto LAB_002953b0;
      pbVar7 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar7 = *pbVar7 | 0x20;
      begin = (char *)((byte *)begin + 1);
      uVar1 = 3;
      break;
    case 0x2e:
      if (((uVar6 & 0x3e00) == 0) || (5 < uVar1)) goto LAB_002953b0;
      begin = parse_precision<char>(begin,end,&specs->super_format_specs,&specs->precision_ref,ctx);
      uVar1 = 6;
      break;
    case 0x30:
      if (3 < uVar1) goto LAB_002953b0;
      if (10 < uVar5) {
        report_error("format specifier requires numeric argument");
      }
      uVar1 = (specs->super_format_specs).super_basic_specs.data_;
      if ((uVar1 & 0x38) == 0) {
        (specs->super_format_specs).super_basic_specs.fill_data_[0] = '0';
        (specs->super_format_specs).super_basic_specs.data_ = uVar1 & 0xfffc7fc7 | 0x8020;
      }
      begin = (char *)((byte *)begin + 1);
      uVar1 = 4;
      break;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x7b:
      if (4 < uVar1) goto LAB_002953b0;
      pVar8 = parse_dynamic_spec<char>
                        (begin,end,&(specs->super_format_specs).width,&specs->width_ref,ctx);
      begin = pVar8.end;
      (specs->super_format_specs).super_basic_specs.data_ =
           pVar8.kind << 6 | (specs->super_format_specs).super_basic_specs.data_ & 0xffffff3f;
      uVar1 = 5;
      break;
    case 0x3c:
    case 0x3e:
    case 0x5e:
      if (uVar1 != 0) goto LAB_002953b0;
      if (bVar2 == 0x3c) {
        uVar1 = 8;
      }
      else if (bVar2 == 0x5e) {
        uVar1 = 0x18;
      }
      else if (bVar2 == 0x3e) {
        uVar1 = 0x10;
      }
      else {
        uVar1 = 0;
      }
      (specs->super_format_specs).super_basic_specs.data_ =
           (specs->super_format_specs).super_basic_specs.data_ & 0xffffffc7 | uVar1;
      begin = (char *)((byte *)begin + 1);
      uVar1 = 1;
      break;
    case 0x3f:
      uVar6 = uVar6 & 0x3100;
joined_r0x0029538a:
      if (uVar6 == 0) {
LAB_002953b0:
        report_error("invalid format specifier");
      }
      uVar6 = ((specs->super_format_specs).super_basic_specs.data_ & 0xfffffff8) + 1;
LAB_00295393:
      (specs->super_format_specs).super_basic_specs.data_ = uVar6;
      return (char *)((byte *)begin + 1);
    case 0x41:
      pbVar7 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar7 = *pbVar7 | 0x10;
    case 0x61:
      uVar6 = uVar6 & 0xe00;
joined_r0x002952e1:
      if (uVar6 == 0) goto LAB_002953b0;
      uVar6 = (specs->super_format_specs).super_basic_specs.data_ & 0xfffffff8 | 4;
      goto LAB_00295393;
    case 0x42:
      pbVar7 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar7 = *pbVar7 | 0x10;
    case 0x62:
      if ((uVar6 & 0x1fe) == 0) goto LAB_002953b0;
      uVar6 = (specs->super_format_specs).super_basic_specs.data_ & 0xfffffff8 | 6;
      goto LAB_00295393;
    case 0x45:
      pbVar7 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar7 = *pbVar7 | 0x10;
    case 0x65:
      uVar6 = uVar6 & 0xe00;
      goto joined_r0x0029538a;
    case 0x46:
      pbVar7 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar7 = *pbVar7 | 0x10;
    case 0x66:
      uVar6 = uVar6 & 0xe00;
joined_r0x00295373:
      if (uVar6 == 0) goto LAB_002953b0;
      uVar6 = (specs->super_format_specs).super_basic_specs.data_ & 0xfffffff8 | 2;
      goto LAB_00295393;
    case 0x47:
      pbVar7 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar7 = *pbVar7 | 0x10;
    case 0x67:
      uVar6 = uVar6 & 0xe00;
joined_r0x00295309:
      if (uVar6 == 0) goto LAB_002953b0;
LAB_0029530f:
      uVar6 = (specs->super_format_specs).super_basic_specs.data_ & 0xfffffff8 | 3;
      goto LAB_00295393;
    case 0x4c:
      if ((10 < uVar5) || (6 < uVar1)) goto LAB_002953b0;
      pbVar7 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar7 = *pbVar7 | 0x40;
      begin = (char *)((byte *)begin + 1);
      uVar1 = 7;
      break;
    case 0x58:
      pbVar7 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar7 = *pbVar7 | 0x10;
    case 0x78:
      uVar6 = uVar6 & 0x1fe;
      goto joined_r0x002952e1;
    case 99:
      if ((arg_type == bool_type) || ((uVar6 & 0x1fe) == 0)) goto LAB_002953b0;
      uVar6 = (specs->super_format_specs).super_basic_specs.data_ | 7;
      goto LAB_00295393;
    case 100:
      if ((uVar6 & 0x1fe) != 0) goto LAB_0029530f;
      goto LAB_002953b0;
    case 0x6f:
      if ((uVar6 & 0x1fe) == 0) goto LAB_002953b0;
      uVar6 = (specs->super_format_specs).super_basic_specs.data_ & 0xfffffff8 | 5;
      goto LAB_00295393;
    case 0x70:
      uVar6 = uVar6 & 0x5000;
      goto joined_r0x00295309;
    case 0x73:
      uVar6 = uVar6 & 0x3080;
      goto joined_r0x00295373;
    case 0x7d:
      return (char *)(byte *)begin;
    }
    if (begin == end) {
      return (char *)(byte *)begin;
    }
    bVar2 = *begin;
  } while( true );
}

Assistant:

FMT_CONSTEXPR auto parse_format_specs(const Char* begin, const Char* end,
                                      dynamic_format_specs<Char>& specs,
                                      parse_context<Char>& ctx, type arg_type)
    -> const Char* {
  auto c = '\0';
  if (end - begin > 1) {
    auto next = to_ascii(begin[1]);
    c = parse_align(next) == align::none ? to_ascii(*begin) : '\0';
  } else {
    if (begin == end) return begin;
    c = to_ascii(*begin);
  }

  struct {
    state current_state = state::start;
    FMT_CONSTEXPR void operator()(state s, bool valid = true) {
      if (current_state >= s || !valid)
        report_error("invalid format specifier");
      current_state = s;
    }
  } enter_state;

  using pres = presentation_type;
  constexpr auto integral_set = sint_set | uint_set | bool_set | char_set;
  struct {
    const Char*& begin;
    format_specs& specs;
    type arg_type;

    FMT_CONSTEXPR auto operator()(pres pres_type, int set) -> const Char* {
      if (!in(arg_type, set)) report_error("invalid format specifier");
      specs.set_type(pres_type);
      return begin + 1;
    }
  } parse_presentation_type{begin, specs, arg_type};

  for (;;) {
    switch (c) {
    case '<':
    case '>':
    case '^':
      enter_state(state::align);
      specs.set_align(parse_align(c));
      ++begin;
      break;
    case '+':
    case ' ':
      specs.set_sign(c == ' ' ? sign::space : sign::plus);
      FMT_FALLTHROUGH;
    case '-':
      enter_state(state::sign, in(arg_type, sint_set | float_set));
      ++begin;
      break;
    case '#':
      enter_state(state::hash, is_arithmetic_type(arg_type));
      specs.set_alt();
      ++begin;
      break;
    case '0':
      enter_state(state::zero);
      if (!is_arithmetic_type(arg_type))
        report_error("format specifier requires numeric argument");
      if (specs.align() == align::none) {
        // Ignore 0 if align is specified for compatibility with std::format.
        specs.set_align(align::numeric);
        specs.set_fill('0');
      }
      ++begin;
      break;
      // clang-format off
    case '1': case '2': case '3': case '4': case '5':
    case '6': case '7': case '8': case '9': case '{':
      // clang-format on
      enter_state(state::width);
      begin = parse_width(begin, end, specs, specs.width_ref, ctx);
      break;
    case '.':
      enter_state(state::precision,
                  in(arg_type, float_set | string_set | cstring_set));
      begin = parse_precision(begin, end, specs, specs.precision_ref, ctx);
      break;
    case 'L':
      enter_state(state::locale, is_arithmetic_type(arg_type));
      specs.set_localized();
      ++begin;
      break;
    case 'd': return parse_presentation_type(pres::dec, integral_set);
    case 'X': specs.set_upper(); FMT_FALLTHROUGH;
    case 'x': return parse_presentation_type(pres::hex, integral_set);
    case 'o': return parse_presentation_type(pres::oct, integral_set);
    case 'B': specs.set_upper(); FMT_FALLTHROUGH;
    case 'b': return parse_presentation_type(pres::bin, integral_set);
    case 'E': specs.set_upper(); FMT_FALLTHROUGH;
    case 'e': return parse_presentation_type(pres::exp, float_set);
    case 'F': specs.set_upper(); FMT_FALLTHROUGH;
    case 'f': return parse_presentation_type(pres::fixed, float_set);
    case 'G': specs.set_upper(); FMT_FALLTHROUGH;
    case 'g': return parse_presentation_type(pres::general, float_set);
    case 'A': specs.set_upper(); FMT_FALLTHROUGH;
    case 'a': return parse_presentation_type(pres::hexfloat, float_set);
    case 'c':
      if (arg_type == type::bool_type) report_error("invalid format specifier");
      return parse_presentation_type(pres::chr, integral_set);
    case 's':
      return parse_presentation_type(pres::string,
                                     bool_set | string_set | cstring_set);
    case 'p':
      return parse_presentation_type(pres::pointer, pointer_set | cstring_set);
    case '?':
      return parse_presentation_type(pres::debug,
                                     char_set | string_set | cstring_set);
    case '}': return begin;
    default:  {
      if (*begin == '}') return begin;
      // Parse fill and alignment.
      auto fill_end = begin + code_point_length(begin);
      if (end - fill_end <= 0) {
        report_error("invalid format specifier");
        return begin;
      }
      if (*begin == '{') {
        report_error("invalid fill character '{'");
        return begin;
      }
      auto alignment = parse_align(to_ascii(*fill_end));
      enter_state(state::align, alignment != align::none);
      specs.set_fill(
          basic_string_view<Char>(begin, to_unsigned(fill_end - begin)));
      specs.set_align(alignment);
      begin = fill_end + 1;
    }
    }
    if (begin == end) return begin;
    c = to_ascii(*begin);
  }
}